

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log_Entry.h
# Opt level: O3

void __thiscall Nova::Log::Log_Entry::~Log_Entry(Log_Entry *this)

{
  pointer pcVar1;
  
  this->_vptr_Log_Entry = (_func_int **)&PTR__Log_Entry_0013c710;
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~Log_Entry() {}